

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O1

_Bool Curl_cw_out_is_paused(Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  Curl_cwriter *pCVar3;
  char *pcVar4;
  
  pCVar3 = Curl_cwriter_get_by_type(data,&Curl_cwt_out);
  if (pCVar3 == (Curl_cwriter *)0x0) {
    _Var2 = false;
  }
  else {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      pcVar4 = "";
      if (((ulong)pCVar3[1].next & 1) == 0) {
        pcVar4 = " not";
      }
      Curl_trc_write(data,"cw-out is%spaused",pcVar4);
    }
    _Var2 = (_Bool)(*(byte *)&pCVar3[1].next & 1);
  }
  return _Var2;
}

Assistant:

bool Curl_cw_out_is_paused(struct Curl_easy *data)
{
  struct Curl_cwriter *cw_out;
  struct cw_out_ctx *ctx;

  cw_out = Curl_cwriter_get_by_type(data, &Curl_cwt_out);
  if(!cw_out)
    return FALSE;

  ctx = (struct cw_out_ctx *)cw_out;
  CURL_TRC_WRITE(data, "cw-out is%spaused", ctx->paused? "" : " not");
  return ctx->paused;
}